

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O0

int check_matrix_entry(SUNMatrix A,realtype val,realtype tol)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  uint local_4c;
  long local_48;
  sunindextype i;
  sunindextype Aldata;
  realtype *Adata;
  int failure;
  realtype tol_local;
  realtype val_local;
  SUNMatrix A_local;
  
  Adata._4_4_ = 0;
  lVar2 = SUNDenseMatrix_Data(A);
  lVar3 = SUNDenseMatrix_LData(A);
  for (local_48 = 0; local_48 < lVar3; local_48 = local_48 + 1) {
    if (NAN(*(double *)(lVar2 + local_48 * 8))) {
      local_4c = 1;
    }
    else {
      local_4c = (uint)(tol < ABS(*(double *)(lVar2 + local_48 * 8) - val) / ABS(val));
    }
    Adata._4_4_ = local_4c + Adata._4_4_;
  }
  if (0.0 < (double)Adata._4_4_) {
    printf("Check_matrix_entry failures:\n");
    for (local_48 = 0; local_48 < lVar3; local_48 = local_48 + 1) {
      if (NAN(*(double *)(lVar2 + local_48 * 8))) {
        bVar1 = true;
      }
      else {
        bVar1 = tol < ABS(*(double *)(lVar2 + local_48 * 8) - val) / ABS(val);
      }
      if (bVar1) {
        printf("  Adata[%ld] = %g != %g (err = %g)\n",*(undefined8 *)(lVar2 + local_48 * 8),val,
               ABS(*(double *)(lVar2 + local_48 * 8) - val),local_48);
      }
    }
  }
  A_local._4_4_ = (uint)(0.0 < (double)Adata._4_4_);
  return A_local._4_4_;
}

Assistant:

int check_matrix_entry(SUNMatrix A, realtype val, realtype tol)
{
  int failure = 0;
  realtype *Adata;
  sunindextype Aldata;
  sunindextype i;
  
  /* get data pointer */
  Adata = SUNDenseMatrix_Data(A);

  /* compare data */
  Aldata = SUNDenseMatrix_LData(A);
  for(i=0; i < Aldata; i++){
    failure += FNEQ(Adata[i], val, tol);
  }

  if (failure > ZERO) {
    printf("Check_matrix_entry failures:\n");
    for(i=0; i < Aldata; i++)
      if (FNEQ(Adata[i], val, tol) != 0)
        printf("  Adata[%ld] = %g != %g (err = %g)\n", (long int) i,
               Adata[i], val, SUNRabs(Adata[i]-val));
  }
  
  if (failure > ZERO)
    return(1);
  else
    return(0);
}